

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O0

void __thiscall Jupiter::IRC::Client::reconnect(Client *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  reference ppPVar4;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  sockaddr *extraout_RDX;
  int in_ESI;
  Plugin **plugin;
  iterator __end1;
  iterator __begin1;
  vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_> *__range1;
  bool successConnect;
  Client *this_local;
  
  if (this->m_connection_status != 0) {
    in_ESI = 0;
    disconnect(this,false);
    in_RDX = extraout_RDX;
  }
  this->m_reconnect_attempts = this->m_reconnect_attempts + 1;
  iVar3 = connect(this,in_ESI,in_RDX,in_ECX);
  bVar1 = (byte)iVar3 & 1;
  (*(this->super_Thinker)._vptr_Thinker[5])(this,(ulong)bVar1);
  __end1 = std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>::begin(&g_plugins);
  plugin = (Plugin **)
           std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>::end(&g_plugins);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
                      (&__end1,(__normal_iterator<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
                                *)&plugin);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppPVar4 = __gnu_cxx::
              __normal_iterator<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
              ::operator*(&__end1);
    (*((*ppPVar4)->super_Thinker)._vptr_Thinker[9])(*ppPVar4,this,(ulong)bVar1);
    __gnu_cxx::
    __normal_iterator<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void Jupiter::IRC::Client::reconnect()
{
	if (m_connection_status != 0) Jupiter::IRC::Client::disconnect();
	m_reconnect_attempts++;
	bool successConnect = Jupiter::IRC::Client::connect();
	this->OnReconnectAttempt(successConnect);
	for (auto& plugin : Jupiter::plugins) {
		plugin->OnReconnectAttempt(this, successConnect);
	}
}